

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

void printBasic(XSObject *xsObject,char *type)

{
  ostream *poVar1;
  XMLCh *toTranscode;
  StrX local_40 [3];
  StrX local_28;
  XMLCh *local_20;
  XMLCh *nameSpace;
  char *type_local;
  XSObject *xsObject_local;
  
  nameSpace = (XMLCh *)type;
  type_local = (char *)xsObject;
  std::operator<<((ostream *)&std::cout,"Name:\t\t\t");
  local_20 = (XMLCh *)(**(code **)(*(long *)type_local + 0x18))();
  if ((local_20 != (XMLCh *)0x0) && (*local_20 != L'\0')) {
    StrX::StrX(&local_28,local_20);
    poVar1 = operator<<((ostream *)&std::cout,&local_28);
    std::operator<<(poVar1,", ");
    StrX::~StrX(&local_28);
  }
  toTranscode = (XMLCh *)(**(code **)(*(long *)type_local + 0x10))();
  StrX::StrX(local_40,toTranscode);
  poVar1 = operator<<((ostream *)&std::cout,local_40);
  std::operator<<(poVar1,"\n");
  StrX::~StrX(local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Component Type:\t");
  poVar1 = std::operator<<(poVar1,(char *)nameSpace);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printBasic(XSObject *xsObject, const char *type)
{
    std::cout << "Name:\t\t\t";
    const XMLCh *nameSpace = xsObject->getNamespace();
    if (nameSpace && *nameSpace) {
        std::cout << StrX(nameSpace) << ", ";
    }
    std::cout << StrX(xsObject->getName()) << "\n";
    std::cout << "Component Type:\t" << type << std::endl;
}